

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall cmCTestScriptHandler::RunCurrentScript(cmCTestScriptHandler *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  ulong uVar2;
  container_type *env;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_d8;
  duration<double,_std::ratio<1L,_1000000000L>_> local_d0;
  cmDuration local_c8;
  uint local_bc;
  uint sleepTime;
  cmDuration minimumInterval;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a8;
  type interval;
  time_point startOfInterval;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_90;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  local_88;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  ending_time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  cmList envArgs;
  int result;
  cmCTestScriptHandler *this_local;
  
  SetRunCurrentScript(this,false);
  cmSystemTools::SetRunCommandHideConsole(true);
  envArgs.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = ExtractVariables(this);
  this_local._4_4_ =
       envArgs.Values.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  if (envArgs.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)&local_68,(string *)&this->CTestEnv);
      local_48 = &local_68;
      local_40 = 1;
      init._M_len = 1;
      init._M_array = local_48;
      cmList::cmList((cmList *)local_38,init);
      local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
      do {
        local_e8 = local_e8 + -1;
        std::__cxx11::string::~string((string *)local_e8);
      } while (local_e8 != &local_68);
      env = cmList::operator_cast_to_vector_((cmList *)local_38);
      cmSystemTools::AppendEnv(env);
      cmList::~cmList((cmList *)local_38);
    }
    if (this->ContinuousDuration < 0.0) {
      envArgs.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = RunConfigurationDashboard(this);
    }
    else {
      UpdateElapsedTime(this);
      local_90.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
                ((duration<double,std::ratio<1l,1l>> *)&startOfInterval,&this->ContinuousDuration);
      local_88 = std::chrono::operator+
                           (&local_90,(duration<double,_std::ratio<1L,_1L>_> *)&startOfInterval);
      if ((this->EmptyBinDirOnce & 1U) != 0) {
        this->EmptyBinDir = true;
      }
      do {
        interval.__r = std::chrono::_V2::steady_clock::now();
        envArgs.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = RunConfigurationDashboard(this);
        minimumInterval.__r = (rep_conflict)std::chrono::_V2::steady_clock::now();
        local_a8.__r = (rep)std::chrono::operator-
                                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&minimumInterval,
                                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&interval);
        std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
                  ((duration<double,std::ratio<1l,1l>> *)&stack0xffffffffffffff48,
                   &this->MinimumInterval);
        bVar1 = std::chrono::operator<
                          (&local_a8,
                           (duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffff48);
        if (bVar1) {
          local_d0.__r = (rep_conflict)
                         std::chrono::operator-
                                   ((duration<double,_std::ratio<1L,_1L>_> *)
                                    &stack0xffffffffffffff48,&local_a8);
          std::chrono::duration<double,std::ratio<1l,1l>>::
          duration<double,std::ratio<1l,1000000000l>,void>
                    ((duration<double,std::ratio<1l,1l>> *)&local_c8,&local_d0);
          local_bc = cmDurationTo<unsigned_int>(&local_c8);
          SleepInSeconds(local_bc);
        }
        if ((this->EmptyBinDirOnce & 1U) != 0) {
          this->EmptyBinDir = false;
        }
        local_d8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        bVar1 = std::chrono::operator<(&local_d8,&local_88);
      } while (bVar1);
    }
    this_local._4_4_ =
         envArgs.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestScriptHandler::RunCurrentScript()
{
  int result;

  // do not run twice
  this->SetRunCurrentScript(false);

  // no popup widows
  cmSystemTools::SetRunCommandHideConsole(true);

  // extract the vars from the cache and store in ivars
  result = this->ExtractVariables();
  if (result) {
    return result;
  }

  // set any environment variables
  if (!this->CTestEnv.empty()) {
    cmList envArgs{ this->CTestEnv };
    cmSystemTools::AppendEnv(envArgs);
  }

  // now that we have done most of the error checking finally run the
  // dashboard, we may be asked to repeatedly run this dashboard, such as
  // for a continuous, do we need to run it more than once?
  if (this->ContinuousDuration >= 0) {
    this->UpdateElapsedTime();
    auto ending_time =
      std::chrono::steady_clock::now() + cmDuration(this->ContinuousDuration);
    if (this->EmptyBinDirOnce) {
      this->EmptyBinDir = true;
    }
    do {
      auto startOfInterval = std::chrono::steady_clock::now();
      result = this->RunConfigurationDashboard();
      auto interval = std::chrono::steady_clock::now() - startOfInterval;
      auto minimumInterval = cmDuration(this->MinimumInterval);
      if (interval < minimumInterval) {
        auto sleepTime =
          cmDurationTo<unsigned int>(minimumInterval - interval);
        this->SleepInSeconds(sleepTime);
      }
      if (this->EmptyBinDirOnce) {
        this->EmptyBinDir = false;
      }
    } while (std::chrono::steady_clock::now() < ending_time);
  }
  // otherwise just run it once
  else {
    result = this->RunConfigurationDashboard();
  }

  return result;
}